

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O2

void DC8uvNoLeft_C(uint8_t *dst)

{
  int dc0;
  uint uVar1;
  long lVar2;
  
  uVar1 = 4;
  for (lVar2 = -0x20; lVar2 != -0x18; lVar2 = lVar2 + 1) {
    uVar1 = uVar1 + dst[lVar2];
  }
  Put8x8uv((uint8_t)(uVar1 >> 3),dst);
  return;
}

Assistant:

static void DC8uvNoLeft_C(uint8_t* dst) {   // DC with no left samples
  int dc0 = 4;
  int i;
  for (i = 0; i < 8; ++i) {
    dc0 += dst[i - BPS];
  }
  Put8x8uv(dc0 >> 3, dst);
}